

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webectl.cpp
# Opt level: O2

void send_to_pid(int pid,string *msg)

{
  int __fd;
  ssize_t sVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  sockaddr_un name;
  
  __fd = socket(1,2,0);
  if (__fd < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/webectl.cpp",
            0x33);
    pcVar2 = "sock";
  }
  else {
    name.sun_family = 1;
    std::__cxx11::to_string(&local_d0,pid);
    std::operator+(&local_f0,"/tmp/webed_",&local_d0);
    std::operator+(&local_b0,&local_f0,".sock");
    strcpy(name.sun_path,local_b0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    sVar1 = sendto(__fd,(msg->_M_dataplus)._M_p,msg->_M_string_length,0,(sockaddr *)&name,0x6e);
    if (-1 < sVar1) {
      close(__fd);
      return;
    }
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/webectl.cpp",
            0x36);
    pcVar2 = 
    "sendto(sock, msg.c_str(), msg.size(), 0, (struct sockaddr *)&name, sizeof(struct sockaddr_un))"
    ;
  }
  fprintf(_stderr,"--> %s\n",pcVar2);
  perror("info");
  exit(1);
}

Assistant:

void send_to_pid(int pid, std::string msg) {
    int sock;
    struct sockaddr_un name;
    sock = socket(AF_UNIX, SOCK_DGRAM, 0);
    IF_NEGATIVE_EXIT(sock);
    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(pid) + ".sock").c_str());
    IF_NEGATIVE_EXIT(sendto(sock, msg.c_str(), msg.size(), 0, (struct sockaddr *)&name, sizeof(struct sockaddr_un)))
    close(sock);
}